

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::EmptyStatementSyntax::setChild
          (EmptyStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  NamedLabelSyntax *pNVar1;
  SyntaxNode *pSVar2;
  long in_RSI;
  long in_RDI;
  Token TVar3;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_RSI == 0) {
    pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x9acd6c);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pNVar1 = (NamedLabelSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x9acd7c);
      pNVar1 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar2);
    }
    *(NamedLabelSyntax **)(in_RDI + 0x18) = pNVar1;
  }
  else if (in_RSI == 1) {
    pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x9acdae);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    TVar3 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffb8);
    local_20 = TVar3._0_8_;
    *(undefined8 *)(in_RDI + 0x58) = local_20;
    local_18 = TVar3.info;
    *(Info **)(in_RDI + 0x60) = local_18;
  }
  return;
}

Assistant:

void EmptyStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: semicolon = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}